

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O2

bool __thiscall Filter::matchDir(Filter *this,string *name)

{
  uint uVar1;
  Args *pAVar2;
  _List_node_base *p_Var3;
  
  pAVar2 = this->m_args;
  p_Var3 = (pAVar2->_inDirs).super__List_base<String,_std::allocator<String>_>._M_impl._M_node.
           super__List_node_base._M_next;
  uVar1 = (uint)(p_Var3 == (_List_node_base *)&pAVar2->_inDirs);
  for (; ((uVar1 & 1) == 0 && (p_Var3 != (_List_node_base *)&pAVar2->_inDirs));
      p_Var3 = p_Var3->_M_next) {
    uVar1 = fnmatch((char *)(p_Var3 + 1),(char *)name,(uint)*(byte *)&p_Var3[3]._M_next);
    pAVar2 = this->m_args;
  }
  return (bool)((byte)uVar1 & 1);
}

Assistant:

bool Filter::matchDir(std::string const & name) const
{
    bool match = m_args.includeDirs().empty();

    // Include filters
    std::list<String>::const_iterator it = m_args.includeDirs().begin();
    for (; !match && it != m_args.includeDirs().end(); ++it) {
		match = fnmatch(*it, name, it->noCase());
    }

    return match;
}